

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSRGBDecodeTests.cpp
# Opt level: O3

bool __thiscall
deqp::gles31::Functional::anon_unknown_0::DecodeToggledCase::verifyResult(DecodeToggledCase *this)

{
  ostringstream *poVar1;
  TestLog *pTVar2;
  ulong uVar3;
  ulong uVar4;
  bool bVar5;
  undefined1 auVar6 [16];
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> pixelResultList;
  Vector<bool,_4> res;
  long *local_1e8;
  long local_1e0;
  long local_1d8 [2];
  undefined1 local_1c8 [16];
  pointer local_1b8;
  Vec4 local_1a8;
  undefined1 local_198 [120];
  ios_base local_120 [264];
  
  pTVar2 = ((this->super_SRGBTestCase).super_TestCase.m_context)->m_testCtx->m_log;
  local_1c8 = (undefined1  [16])0x0;
  local_1b8 = (pointer)0x0;
  SRGBTestCase::readResultTextures(&this->super_SRGBTestCase);
  SRGBTestCase::storeResultPixels
            (&this->super_SRGBTestCase,
             (vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_1c8);
  local_198._0_8_ = local_198 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_198,"Expected color: ","");
  local_1a8.m_data[0] = 0.0;
  local_1a8.m_data[1] = 1.0;
  local_1a8.m_data[2] = 0.0;
  local_1a8.m_data[3] = 1.0;
  SRGBTestCase::logColor
            ((SRGBTestCase *)((this->super_SRGBTestCase).super_TestCase.m_context)->m_testCtx->m_log
             ,(string *)local_198,0,&local_1a8);
  if ((undefined1 *)local_198._0_8_ != local_198 + 0x10) {
    operator_delete((void *)local_198._0_8_,local_198._16_8_ + 1);
  }
  auVar6._4_4_ = -(uint)(((float *)local_1c8._0_8_)[1] == 1.0);
  auVar6._0_4_ = -(uint)(*(float *)local_1c8._0_8_ == 0.0);
  auVar6._8_4_ = -(uint)(((float *)local_1c8._0_8_)[2] == 0.0);
  auVar6._12_4_ = -(uint)(((float *)local_1c8._0_8_)[3] == 1.0);
  auVar6 = packssdw(auVar6,auVar6);
  auVar6 = packsswb(auVar6,auVar6);
  local_198._0_8_ = pTVar2;
  if ((byte)(auVar6[0] & DAT_00967bd0) != 0) {
    uVar3 = 0;
    do {
      uVar4 = uVar3;
      if (uVar4 == 3) break;
      uVar3 = uVar4 + 1;
    } while (local_198[uVar4 + 1] != '\0');
    if (2 < uVar4) {
      poVar1 = (ostringstream *)(local_198 + 8);
      std::__cxx11::ostringstream::ostringstream(poVar1);
      local_1e8 = local_1d8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_1e8,"returned pass color from GPU","");
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,(char *)local_1e8,local_1e0);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_198,(EndMessageToken *)&tcu::TestLog::EndMessage);
      if (local_1e8 != local_1d8) {
        operator_delete(local_1e8,local_1d8[0] + 1);
      }
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      std::ios_base::~ios_base(local_120);
      bVar5 = true;
      goto LAB_0045aec4;
    }
  }
  poVar1 = (ostringstream *)(local_198 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar1);
  local_1e8 = local_1d8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1e8,"returned fail color from GPU","");
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,(char *)local_1e8,local_1e0);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_198,(EndMessageToken *)&tcu::TestLog::EndMessage);
  if (local_1e8 != local_1d8) {
    operator_delete(local_1e8,local_1d8[0] + 1);
  }
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base(local_120);
  bVar5 = false;
LAB_0045aec4:
  if ((pointer)local_1c8._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_1c8._0_8_,(long)local_1b8 - local_1c8._0_8_);
  }
  return bVar5;
}

Assistant:

bool DecodeToggledCase::verifyResult (void)
{
	tcu::TestLog&			log				= m_context.getTestContext().getLog();
	const int				resultColorIdx	= 0;
	std::vector<tcu::Vec4>	pixelResultList;

	this->readResultTextures();
	this->storeResultPixels(pixelResultList);
	this->logColor(std::string("Expected color: "), resultColorIdx, getColorGreenPass());

	//	result color is either green (pass) or fail (red)
	if ( tcu::boolAll(tcu::equal(pixelResultList[resultColorIdx], getColorGreenPass())) )
	{
		log << tcu::TestLog::Message << std::string("returned pass color from GPU") << tcu::TestLog::EndMessage;
		return true;
	}
	else
	{
		log << tcu::TestLog::Message << std::string("returned fail color from GPU") << tcu::TestLog::EndMessage;
		return false;
	}
}